

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory_test.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ComplexFactory *this;
  SimpleFactory *this_00;
  undefined4 extraout_var;
  Shape local_80;
  undefined8 local_60;
  Shape *complexShape;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string name;
  Shape *simpleShape;
  AbstractFactory *simpleFactry;
  AbstractFactory *complexFactry;
  
  this = (ComplexFactory *)operator_new(8);
  ComplexFactory::ComplexFactory(this);
  this_00 = (SimpleFactory *)operator_new(8);
  SimpleFactory::SimpleFactory(this_00);
  (**(this_00->super_AbstractFactory)._vptr_AbstractFactory)();
  Shape::getValue_abi_cxx11_((Shape *)local_48);
  bVar1 = std::operator==(local_48,"circle");
  if (!bVar1) {
    __assert_fail("name == \"circle\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/abstract_factory_test.cc"
                  ,0xd,"int main()");
  }
  iVar2 = (**(this->super_AbstractFactory)._vptr_AbstractFactory)();
  local_60 = CONCAT44(extraout_var,iVar2);
  Shape::getValue_abi_cxx11_(&local_80);
  std::__cxx11::string::operator=((string *)local_48,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = std::operator==(local_48,"ellipse");
  if (!bVar1) {
    __assert_fail("name == \"ellipse\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/abstract_factory_test.cc"
                  ,0x11,"int main()");
  }
  std::__cxx11::string::~string((string *)local_48);
  return 0;
}

Assistant:

int main() {
  AbstractFactory *complexFactry = new ComplexFactory;
  AbstractFactory *simpleFactry = new SimpleFactory;

  Shape *simpleShape = simpleFactry->createCurvedInstance();
  std::string name = simpleShape->getValue();
  assert(name == "circle");

  Shape *complexShape = complexFactry->createCurvedInstance();
  name = complexShape->getValue();
  assert(name == "ellipse");
}